

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O3

void __thiscall
tchecker::details::expression_typechecker_t::visit
          (expression_typechecker_t *this,par_expression_t *expr)

{
  typed_par_expression_t *ptVar1;
  undefined8 uVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  element_type eVar6;
  undefined8 uVar7;
  expression_type_t expr_type;
  shared_ptr<tchecker::typed_expression_t> typed_sub_expr;
  undefined1 local_d8 [36];
  expression_type_t local_b4;
  element_type *local_b0;
  long local_a8;
  element_type local_a0;
  long lStack_98;
  string local_90;
  undefined1 local_70 [40];
  clock_variables_t *pcStack_48;
  _Any_data local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  peVar5 = (expr->_expr).
           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar5->_vptr_expression_t[3])(peVar5,this);
  acquire_typed_expression((expression_typechecker_t *)local_70);
  local_b4 = type_par(*(expression_type_t *)(local_70._0_8_ + 8));
  local_d8._0_8_ = (typed_par_expression_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_par_expression_t,std::allocator<tchecker::typed_par_expression_t>,tchecker::expression_type_t&,std::shared_ptr<tchecker::typed_expression_t>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
             (typed_par_expression_t **)local_d8,
             (allocator<tchecker::typed_par_expression_t> *)&local_b0,&local_b4,
             (shared_ptr<tchecker::typed_expression_t> *)local_70);
  uVar2 = local_d8._8_8_;
  uVar7 = local_d8._0_8_;
  local_d8._0_8_ = (typed_par_expression_t *)0x0;
  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->_typed_expr).
           super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->_typed_expr).super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar7;
  (this->_typed_expr).super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  if ((local_b4 != EXPR_TYPE_BAD) || (*(int *)(local_70._0_8_ + 8) == 0)) goto LAB_001c743d;
  expression_t::to_string_abi_cxx11_
            ((string *)&local_40,
             (expression_t *)(&expr->field_0x0 + *(long *)(*(long *)expr + -0x38)));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x211739);
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar3 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar3 == p_Var4) {
    local_70._32_8_ = p_Var4->_vptr__Sp_counted_base;
    pcStack_48 = (clock_variables_t *)plVar3[3];
    local_70._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x20);
  }
  else {
    local_70._32_8_ = p_Var4->_vptr__Sp_counted_base;
    local_70._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar3;
  }
  local_70._24_8_ = plVar3[1];
  *plVar3 = (long)p_Var4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_70 + 0x10);
  peVar5 = (element_type *)(plVar3 + 2);
  if ((element_type *)*plVar3 == peVar5) {
    local_a0._vptr_expression_t = peVar5->_vptr_expression_t;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0._vptr_expression_t = peVar5->_vptr_expression_t;
    local_b0 = (element_type *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)peVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  expression_t::to_string_abi_cxx11_
            (&local_90,
             (expr->_expr).
             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  eVar6._vptr_expression_t = (_func_int **)0xf;
  if (local_b0 != &local_a0) {
    eVar6._vptr_expression_t = local_a0._vptr_expression_t;
  }
  if (eVar6._vptr_expression_t < (_func_int **)(local_a8 + local_90._M_string_length)) {
    uVar7 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar7 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (_func_int **)(local_a8 + local_90._M_string_length)) goto LAB_001c7592;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_001c7592:
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
  }
  local_d8._0_8_ = local_d8 + 0x10;
  ptVar1 = (typed_par_expression_t *)(plVar3 + 2);
  if ((typed_par_expression_t *)*plVar3 == ptVar1) {
    local_d8._16_8_ = *(undefined8 *)&ptVar1->super_typed_expression_t;
    local_d8._24_8_ = plVar3[3];
  }
  else {
    local_d8._16_8_ = *(undefined8 *)&ptVar1->super_typed_expression_t;
    local_d8._0_8_ = (typed_par_expression_t *)*plVar3;
  }
  local_d8._8_8_ = plVar3[1];
  *plVar3 = (long)ptVar1;
  plVar3[1] = 0;
  *(undefined1 *)&ptVar1->super_typed_expression_t = 0;
  if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->_error)._M_invoker)
            ((_Any_data *)&this->_error,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  if ((typed_par_expression_t *)local_d8._0_8_ != (typed_par_expression_t *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,(long)local_a0._vptr_expression_t + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x20)) {
    operator_delete((void *)local_70._16_8_,
                    (ulong)((long)&(((array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_70._32_8_)->
                                   super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).
                                   super_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._index._key_map.m_flat_tree.m_data.m_seq.m_holder.m_start + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_unused._0_8_ != &local_30) {
    operator_delete(local_40._M_unused._M_object,(ulong)(local_30._M_allocated_capacity + 1));
  }
LAB_001c743d:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  return;
}

Assistant:

virtual void visit(tchecker::par_expression_t const & expr)
  {
    // Sub expression
    expr.expr().visit(*this);
    std::shared_ptr<tchecker::typed_expression_t> const typed_sub_expr{acquire_typed_expression()};

    // Typed expression
    enum tchecker::expression_type_t expr_type = type_par(typed_sub_expr->type());

    _typed_expr = std::make_shared<tchecker::typed_par_expression_t>(expr_type, typed_sub_expr);

    // Report bad type
    if (expr_type != tchecker::EXPR_TYPE_BAD)
      return;

    if (typed_sub_expr->type() != tchecker::EXPR_TYPE_BAD)
      _error("in expression " + expr.to_string() + ", invalid parentheses around " + expr.expr().to_string());
  }